

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_end_utt(ps_decoder_t *ps)

{
  uint8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ps_search_t *ppVar5;
  int iVar6;
  int iVar7;
  ps_seg_t *ppVar8;
  char *pcVar9;
  long ln;
  int iVar10;
  int32 score;
  ulong local_40;
  ulong local_38;
  
  if (ps->search == (ps_search_t *)0x0) {
    pcVar9 = 
    "No search module is selected, did you forget to specify a language model or grammar?\n";
    ln = 0x51b;
  }
  else {
    uVar1 = ps->acmod->state;
    if ((uVar1 != '\x03') && (uVar1 != '\0')) {
      acmod_end_utt(ps->acmod);
      iVar6 = ps_search_forward(ps);
      if ((iVar6 < 0) ||
         ((ppVar5 = ps->phone_loop, ppVar5 != (ps_search_t *)0x0 &&
          (iVar6 = (*ppVar5->vt->finish)(ppVar5), iVar6 < 0)))) {
        ptmr_stop(&ps->perf);
        return iVar6;
      }
      iVar6 = ps->acmod->output_frame;
      iVar7 = ps->pl_window;
      iVar10 = iVar6 - iVar7;
      if (0 < iVar7 && iVar7 <= iVar6) {
        do {
          (*ps->search->vt->step)(ps->search,iVar10);
          iVar10 = iVar10 + 1;
        } while (iVar10 < ps->acmod->output_frame);
      }
      iVar6 = (*ps->search->vt->finish)(ps->search);
      ptmr_stop(&ps->perf);
      if (iVar6 < 0) {
        return iVar6;
      }
      iVar7 = ps_config_bool(ps->config,"backtrace");
      if (iVar7 == 0) {
        return iVar6;
      }
      pcVar9 = ps_get_hyp(ps,&score);
      if (pcVar9 == (char *)0x0) {
        return iVar6;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x546,"%s (%d)\n",pcVar9,(ulong)(uint)score);
      err_msg(ERR_INFO,(char *)0x0,0,"%-20s %-5s %-5s %-5s %-10s %-10s %-3s\n","word","start","end",
              "pprob","ascr","lscr","lback");
      for (ppVar8 = ps_seg_iter(ps); ppVar8 != (ps_seg_t *)0x0;
          ppVar8 = (*ppVar8->vt->seg_next)(ppVar8)) {
        pcVar9 = ppVar8->text;
        uVar2 = ppVar8->sf;
        local_38 = (ulong)(uint)ppVar8->ef;
        local_40 = (ulong)(uint)ppVar8->ascr;
        uVar3 = ppVar8->lscr;
        uVar4 = ppVar8->lback;
        logmath_exp(ps->lmath,ppVar8->prob);
        err_msg(ERR_INFO,(char *)0x0,0,"%-20s %-5d %-5d %-1.3f %-10d %-10d %-3d\n",pcVar9,
                (ulong)uVar2,local_38,local_40,(ulong)uVar3,(ulong)uVar4);
      }
      return iVar6;
    }
    pcVar9 = "Utterance is not started\n";
    ln = 0x51f;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
          ,ln,pcVar9);
  return -1;
}

Assistant:

int
ps_end_utt(ps_decoder_t *ps)
{
    int rv, i;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    if (ps->acmod->state == ACMOD_ENDED || ps->acmod->state == ACMOD_IDLE) {
	E_ERROR("Utterance is not started\n");
	return -1;
    }
    acmod_end_utt(ps->acmod);

    /* Search any remaining frames. */
    if ((rv = ps_search_forward(ps)) < 0) {
        ptmr_stop(&ps->perf);
        return rv;
    }
    /* Finish phone loop search. */
    if (ps->phone_loop) {
        if ((rv = ps_search_finish(ps->phone_loop)) < 0) {
            ptmr_stop(&ps->perf);
            return rv;
        }
    }
    /* Search any frames remaining in the lookahead window. */
    if (ps->acmod->output_frame >= ps->pl_window) {
        for (i = ps->acmod->output_frame - ps->pl_window;
             i < ps->acmod->output_frame; ++i)
            ps_search_step(ps->search, i);
    }
    /* Finish main search. */
    if ((rv = ps_search_finish(ps->search)) < 0) {
        ptmr_stop(&ps->perf);
        return rv;
    }
    ptmr_stop(&ps->perf);

    /* Log a backtrace if requested. */
    if (ps_config_bool(ps->config, "backtrace")) {
        const char* hyp;
        ps_seg_t *seg;
        int32 score;

        hyp = ps_get_hyp(ps, &score);
        
        if (hyp != NULL) {
    	    E_INFO("%s (%d)\n", hyp, score);
    	    E_INFO_NOFN("%-20s %-5s %-5s %-5s %-10s %-10s %-3s\n",
                    "word", "start", "end", "pprob", "ascr", "lscr", "lback");
    	    for (seg = ps_seg_iter(ps); seg;
        	 seg = ps_seg_next(seg)) {
    	        char const *word;
        	int sf, ef;
        	int32 post, lscr, ascr, lback;

        	word = ps_seg_word(seg);
        	ps_seg_frames(seg, &sf, &ef);
        	post = ps_seg_prob(seg, &ascr, &lscr, &lback);
        	E_INFO_NOFN("%-20s %-5d %-5d %-1.3f %-10d %-10d %-3d\n",
                    	    word, sf, ef, logmath_exp(ps_get_logmath(ps), post),
                    	ascr, lscr, lback);
    	    }
        }
    }
    return rv;
}